

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteInfixBinaryExpr
          (CWriter *this,Opcode opcode,char *op,AssignOp assign_op)

{
  Type type;
  size_t sVar1;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u;
  StackVar local_4c;
  Opcode opcode_local;
  StackVar local_3c;
  
  opcode_local = opcode;
  type = Opcode::GetResultType(&opcode_local);
  local_4c.index = 1;
  local_4c.type = type;
  Write(this,&local_4c);
  if (assign_op == Allowed) {
    local_4c.index = 0;
    local_4c.type.enum_ = Any;
    local_4c.type.type_index_ = 0;
    WriteData(this," ",1);
    sVar1 = strlen(op);
    WriteData(this,op,sVar1);
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::StackVar>
              ((CWriter *)this,(char (*) [3])0x1e5cd8,&local_4c);
    u = extraout_RDX;
  }
  else {
    local_4c.index = 1;
    local_4c.type.enum_ = Any;
    local_4c.type.type_index_ = 0;
    local_3c.index = 0;
    local_3c.type.enum_ = Any;
    local_3c.type.type_index_ = 0;
    WriteData(this," = ",3);
    Write(this,&local_4c);
    WriteData(this," ",1);
    sVar1 = strlen(op);
    WriteData(this,op,sVar1);
    WriteData(this," ",1);
    Write(this,&local_3c);
    u = extraout_RDX_00;
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [2])0x1e5996,u);
  DropTypes(this,2);
  PushType(this,type);
  return;
}

Assistant:

void CWriter::WriteInfixBinaryExpr(Opcode opcode,
                                   const char* op,
                                   AssignOp assign_op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type));
  if (assign_op == AssignOp::Allowed) {
    Write(" ", op, "= ", StackVar(0));
  } else {
    Write(" = ", StackVar(1), " ", op, " ", StackVar(0));
  }
  Write(";", Newline());
  DropTypes(2);
  PushType(result_type);
}